

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_encodeBinary(void *src,UA_DataType *type,UA_exchangeEncodeBuffer exchangeCallback,
               void *exchangeHandle,UA_ByteString *dst,size_t *offset)

{
  UA_StatusCode UVar1;
  
  pos = dst->data + *offset;
  end = dst->data + dst->length;
  encodeBuf = dst;
  exchangeBufferCallback = exchangeCallback;
  exchangeBufferCallbackHandle = exchangeHandle;
  UVar1 = UA_encodeBinaryInternal(src,type);
  *offset = (long)pos - (long)dst->data;
  return UVar1;
}

Assistant:

UA_StatusCode
UA_encodeBinary(const void *src, const UA_DataType *type,
                UA_exchangeEncodeBuffer exchangeCallback, void *exchangeHandle,
                UA_ByteString *dst, size_t *offset) {
    /* Set the (thread-local) position and end pointers to save function
       arguments */
    pos = &dst->data[*offset];
    end = &dst->data[dst->length];

    /* Set the (thread-local) exchangeBufferCallbacks where the buffer is exchanged and the
       current chunk sent out */
    encodeBuf = dst;
    exchangeBufferCallback = exchangeCallback;
    exchangeBufferCallbackHandle = exchangeHandle;

    /* Encode and clean up */
    UA_StatusCode retval = UA_encodeBinaryInternal(src, type);
    *offset = (size_t)(pos - dst->data) / sizeof(UA_Byte);
    return retval;
}